

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_init_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  uint uVar1;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  size_t err_code_1;
  U64 pledgedSrcSize;
  ZSTD_cParamMode_e mode;
  size_t dictSize;
  size_t err_code;
  ZSTD_prefixDict prefixDict;
  ZSTD_CCtx_params params;
  ZSTD_compressionParameters *in_stack_fffffffffffffe88;
  ZSTD_paramSwitch_e mode_00;
  ZSTD_CCtx_params *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ZSTD_CCtx *in_stack_fffffffffffffeb8;
  uint local_140;
  undefined8 uVar3;
  size_t dictSize_00;
  void *dict;
  undefined4 in_stack_ffffffffffffff08;
  ZSTD_cParamMode_e in_stack_ffffffffffffff0c;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  ZSTD_strategy in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  U64 in_stack_ffffffffffffff38;
  ZSTD_buffered_policy_e in_stack_ffffffffffffff40;
  ZSTD_paramSwitch_e local_98;
  int local_70;
  ZSTD_paramSwitch_e local_6c;
  size_t local_30;
  ZSTD_paramSwitch_e local_28;
  ZSTD_CDict *local_8;
  
  memcpy(&stack0xffffffffffffff08,(void *)(in_RDI + 0x10),0xd8);
  uVar3 = *(undefined8 *)(in_RDI + 0xe78);
  dictSize_00 = *(size_t *)(in_RDI + 0xe80);
  dict = *(void **)(in_RDI + 0xe88);
  local_8 = (ZSTD_CDict *)ZSTD_initLocalDict(in_stack_fffffffffffffeb8);
  uVar1 = ERR_isError((size_t)local_8);
  if (uVar1 == 0) {
    memset((void *)(in_RDI + 0xe78),0,0x18);
    if ((*(long *)(in_RDI + 0xe70) != 0) && (*(long *)(in_RDI + 0xe68) == 0)) {
      in_stack_ffffffffffffff34 = *(int *)(*(long *)(in_RDI + 0xe70) + 0x17b4);
    }
    if (in_ESI == 2) {
      *(long *)(in_RDI + 0x2f8) = in_RDX + 1;
    }
    ZSTD_getCParamMode((ZSTD_CDict *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       in_stack_fffffffffffffe90,(U64)in_stack_fffffffffffffe88);
    mode_00 = (ZSTD_paramSwitch_e)in_stack_fffffffffffffe90;
    ZSTD_getCParamsFromCCtxParams
              ((ZSTD_CCtx_params *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    ZSTD_resolveBlockSplitterMode(local_6c,(ZSTD_compressionParameters *)&stack0xffffffffffffff0c);
    ZSTD_resolveEnableLdm(local_98,(ZSTD_compressionParameters *)&stack0xffffffffffffff0c);
    ZSTD_resolveRowMatchFinderMode(mode_00,in_stack_fffffffffffffe88);
    ZSTD_resolveExternalSequenceValidation(local_70);
    ZSTD_resolveMaxBlockSize(local_30);
    ZSTD_resolveExternalRepcodeSearch(local_28,in_stack_ffffffffffffff34);
    lVar2 = *(long *)(in_RDI + 0x2f8) + -1;
    local_8 = (ZSTD_CDict *)
              ZSTD_compressBegin_internal
                        ((ZSTD_CCtx *)CONCAT44(local_140,in_stack_ffffffffffffff08),dict,dictSize_00
                         ,(ZSTD_dictContentType_e)((ulong)uVar3 >> 0x20),
                         (ZSTD_dictTableLoadMethod_e)uVar3,local_8,
                         (ZSTD_CCtx_params *)
                         CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
    uVar1 = ERR_isError((size_t)local_8);
    if (uVar1 == 0) {
      *(undefined8 *)(in_RDI + 0xde0) = 0;
      *(undefined8 *)(in_RDI + 0xde8) = 0;
      if (*(int *)(in_RDI + 0x164) == 0) {
        *(ulong *)(in_RDI + 0xdf0) =
             *(long *)(in_RDI + 0x2f0) + (ulong)(*(long *)(in_RDI + 0x2f0) == lVar2);
      }
      else {
        *(undefined8 *)(in_RDI + 0xdf0) = 0;
      }
      *(undefined8 *)(in_RDI + 0xe10) = 0;
      *(undefined8 *)(in_RDI + 0xe08) = 0;
      *(undefined4 *)(in_RDI + 0xe18) = 1;
      *(undefined4 *)(in_RDI + 0xe1c) = 0;
      local_8 = (ZSTD_CDict *)0x0;
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        ZSTD_hasExtSeqProd(&params) && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}